

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O3

void my_numbox_size(t_my_numbox *x,t_symbol *s,int ac,t_atom *av)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  t_float tVar7;
  
  tVar7 = atom_getfloatarg(0,ac,av);
  iVar1 = 1;
  if (1 < (int)tVar7) {
    iVar1 = (int)tVar7;
  }
  x->x_numwidth = iVar1;
  if (ac < 2) {
    iVar3 = (x->x_gui).x_h;
    iVar2 = ((x->x_gui).x_glist)->gl_zoom;
  }
  else {
    tVar7 = atom_getfloatarg(1,ac,av);
    iVar3 = 8;
    if (8 < (int)tVar7) {
      iVar3 = (int)tVar7;
    }
    iVar2 = ((x->x_gui).x_glist)->gl_zoom;
    iVar3 = iVar3 * iVar2;
    (x->x_gui).x_h = iVar3;
    iVar1 = x->x_numwidth;
  }
  uVar4 = (uint)(x->x_gui).x_fsf & 0x3f;
  iVar6 = 0x1f;
  if (uVar4 == 2) {
    iVar6 = 0x19;
  }
  iVar5 = 0x1b;
  if (uVar4 != 1) {
    iVar5 = iVar6;
  }
  (x->x_gui).x_w =
       ((int)(CONCAT44(iVar3 - (iVar3 >> 0x1f) >> 0x1f,iVar3 / 2) / (long)iVar2) +
        (iVar1 * (x->x_gui).x_fontsize * iVar5) / 0x24 + 4) * iVar2;
  iemgui_size(x,&x->x_gui);
  (*(x->x_gui).x_draw)(x,(x->x_gui).x_glist,0);
  return;
}

Assistant:

static void my_numbox_size(t_my_numbox *x, t_symbol *s, int ac, t_atom *av)
{
    int h, w;

    w = (int)atom_getfloatarg(0, ac, av);
    if(w < MINDIGITS)
        w = MINDIGITS;
    x->x_numwidth = w;
    if(ac > 1)
    {
        h = (int)atom_getfloatarg(1, ac, av);
        if(h < IEM_GUI_MINSIZE)
            h = IEM_GUI_MINSIZE;
        x->x_gui.x_h = h * IEMGUI_ZOOM(x);
    }
    my_numbox_calc_fontwidth(x);
    iemgui_size((void *)x, &x->x_gui);
    (*x->x_gui.x_draw)(x, x->x_gui.x_glist, IEM_GUI_DRAW_MODE_UPDATE);
}